

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestChildExtension::~TestChildExtension(TestChildExtension *this)

{
  SharedDtor((MessageLite *)this);
  return;
}

Assistant:

TestChildExtension::~TestChildExtension() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestChildExtension)
  SharedDtor(*this);
}